

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebuilder.cc
# Opt level: O2

void __thiscall Typelib::TypeBuilder::addPointer(TypeBuilder *this,int level)

{
  Registry *pRVar1;
  Type *new_type;
  bool bVar2;
  string local_70;
  string local_50;
  
  while (bVar2 = level != 0, level = level + -1, bVar2) {
    pRVar1 = this->m_registry;
    Type::getName_abi_cxx11_(&local_50,this->m_type);
    Pointer::getPointerName(&local_70,&local_50);
    new_type = Registry::get_(pRVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (new_type == (Type *)0x0) {
      new_type = (Type *)operator_new(0x48);
      Pointer::Pointer((Pointer *)new_type,this->m_type);
      pRVar1 = this->m_registry;
      std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_50);
      Registry::add(pRVar1,new_type,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    this->m_type = new_type;
  }
  return;
}

Assistant:

void TypeBuilder::addPointer(int level)
    {
        for (; level; --level)
        {
            // Try to get the type object in the registry
            Type* base_type = m_registry.get_(Pointer::getPointerName(m_type->getName()));
            if (base_type)
                m_type = base_type;
            else
            {
                Type* new_type = new Pointer(*m_type);
                m_registry.add(new_type);
                m_type = new_type;
            }
        }
    }